

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::FileDescriptorProto::_InternalParse
          (FileDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  InternalMetadataWithArena *metadata;
  RepeatedField<int> *this_00;
  RepeatedField<int> *this_01;
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  EnumDescriptorProto *msg;
  string *psVar8;
  DescriptorProto *msg_00;
  FileOptions *msg_01;
  ServiceDescriptorProto *msg_02;
  Rep *pRVar9;
  FieldDescriptorProto *msg_03;
  SourceCodeInfo *msg_04;
  char cVar10;
  uint32 uVar11;
  uint tag;
  int iVar12;
  Arena *pAVar13;
  RepeatedField<int> *object;
  char *ptr_00;
  ArenaStringPtr *this_02;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  pair<const_char_*,_bool> pVar16;
  
  metadata = &this->_internal_metadata_;
  this_00 = &this->weak_dependency_;
  this_01 = &this->public_dependency_;
LAB_0016b200:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar16 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar16.first;
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    bVar1 = *ptr;
    pVar14.second._0_1_ = bVar1;
    pVar14.first = (char *)((byte *)ptr + 1);
    pVar14._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar11 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar14 = internal::ReadTagFallback(ptr,uVar11);
        if (pVar14.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        pVar14.second = uVar11;
        pVar14.first = (char *)((byte *)ptr + 2);
        pVar14._12_4_ = 0;
      }
    }
    ptr_00 = pVar14.first;
    tag = pVar14.second;
    cVar10 = (char)pVar14.second;
    switch((uint)(pVar14._8_8_ >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 != '\n') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      pAVar13 = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar13 & 1) != 0) {
        pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
      }
      psVar8 = (this->name_).ptr_;
      this_02 = &this->name_;
      if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
LAB_0016b643:
        internal::ArenaStringPtr::CreateInstance
                  (this_02,pAVar13,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar8 = this_02->ptr_;
      }
LAB_0016b655:
      ptr = internal::InlineGreedyStringParser(psVar8,ptr_00,ctx);
      goto LAB_0016b944;
    case 2:
      if (cVar10 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pAVar13 = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
        if (((ulong)pAVar13 & 1) != 0) {
          pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
        }
        psVar8 = (this->package_).ptr_;
        this_02 = &this->package_;
        if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016b643;
        goto LAB_0016b655;
      }
      break;
    case 3:
      if (cVar10 == '\x1a') {
        ptr = ptr_00 + -1;
        do {
          pRVar9 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar12 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016b46e:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->dependency_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar9 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar9->allocated_size;
LAB_0016b47e:
            pRVar9->allocated_size = iVar12 + 1;
            pAVar13 = (this->dependency_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar13 == (Arena *)0x0) {
              psVar8 = (string *)operator_new(0x20);
            }
            else {
              if (pAVar13->hooks_cookie_ != (void *)0x0) {
                Arena::OnArenaAllocation(pAVar13,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              }
              psVar8 = (string *)
                       internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                 (&pAVar13->impl_,0x20,
                                  internal::arena_destruct_object<std::__cxx11::string>);
            }
            (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
            psVar8->_M_string_length = 0;
            (psVar8->field_2)._M_local_buf[0] = '\0';
            pRVar9 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar9->elements[iVar12] = psVar8;
          }
          else {
            iVar3 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar9->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->dependency_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016b46e;
              goto LAB_0016b47e;
            }
            (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            psVar8 = (string *)pRVar9->elements[iVar3];
          }
          ptr = internal::InlineGreedyStringParser(psVar8,(char *)((byte *)ptr + 1),ctx);
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x1a));
        goto LAB_0016b200;
      }
      break;
    case 4:
      if (cVar10 == '\"') {
        ptr = ptr_00 + -1;
        do {
          pRVar9 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar12 = (this->message_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016b53a:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->message_type_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar9 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar9->allocated_size;
LAB_0016b54c:
            pRVar9->allocated_size = iVar12 + 1;
            msg_00 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                               ((this->message_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar9 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar9->elements[iVar12] = msg_00;
          }
          else {
            iVar3 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar9->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->message_type_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016b53a;
              goto LAB_0016b54c;
            }
            (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_00 = (DescriptorProto *)pRVar9->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                          (ctx,msg_00,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x22));
        goto LAB_0016b200;
      }
      break;
    case 5:
      if (cVar10 == '*') {
        ptr = ptr_00 + -1;
        do {
          pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar12 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016b2f9:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar9->allocated_size;
LAB_0016b30b:
            pRVar9->allocated_size = iVar12 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                            ((this->enum_type_).super_RepeatedPtrFieldBase.arena_);
            pRVar9 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar9->elements[iVar12] = msg;
          }
          else {
            iVar3 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar9->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016b2f9;
              goto LAB_0016b30b;
            }
            (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (EnumDescriptorProto *)pRVar9->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                          (ctx,msg,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x2a));
        goto LAB_0016b200;
      }
      break;
    case 6:
      if (cVar10 == '2') {
        ptr = ptr_00 + -1;
        do {
          pRVar9 = (this->service_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar12 = (this->service_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016b681:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->service_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar9 = (this->service_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar9->allocated_size;
LAB_0016b693:
            pRVar9->allocated_size = iVar12 + 1;
            msg_02 = Arena::CreateMaybeMessage<google::protobuf::ServiceDescriptorProto>
                               ((this->service_).super_RepeatedPtrFieldBase.arena_);
            pRVar9 = (this->service_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
            (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar9->elements[iVar12] = msg_02;
          }
          else {
            iVar3 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar9->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->service_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016b681;
              goto LAB_0016b693;
            }
            (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_02 = (ServiceDescriptorProto *)pRVar9->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::ServiceDescriptorProto>
                          (ctx,msg_02,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x32));
        goto LAB_0016b200;
      }
      break;
    case 7:
      if (cVar10 == ':') {
        ptr = ptr_00 + -1;
        do {
          pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar9 == (Rep *)0x0) {
            iVar12 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
LAB_0016b72f:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->extension_).super_RepeatedPtrFieldBase,iVar12 + 1);
            pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = pRVar9->allocated_size;
LAB_0016b744:
            pRVar9->allocated_size = iVar12 + 1;
            msg_03 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                               ((this->extension_).super_RepeatedPtrFieldBase.arena_);
            pRVar9 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
            iVar12 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
            pRVar9->elements[iVar12] = msg_03;
          }
          else {
            iVar3 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
            iVar12 = pRVar9->allocated_size;
            if (iVar12 <= iVar3) {
              if (iVar12 == (this->extension_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0016b72f;
              goto LAB_0016b744;
            }
            (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg_03 = (FieldDescriptorProto *)pRVar9->elements[iVar3];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                          (ctx,msg_03,(char *)((byte *)ptr + 1));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x3a));
        goto LAB_0016b200;
      }
      break;
    case 8:
      if (cVar10 == 'B') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        msg_01 = this->options_;
        if (msg_01 == (FileOptions *)0x0) {
          pAVar13 = (Arena *)(metadata->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             ).ptr_;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
          }
          msg_01 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(pAVar13);
          this->options_ = msg_01;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::FileOptions>(ctx,msg_01,ptr_00)
        ;
        goto LAB_0016b944;
      }
      break;
    case 9:
      if (cVar10 == 'J') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        msg_04 = this->source_code_info_;
        if (msg_04 == (SourceCodeInfo *)0x0) {
          pAVar13 = (Arena *)(metadata->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             ).ptr_;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
          }
          msg_04 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo>(pAVar13);
          this->source_code_info_ = msg_04;
        }
        ptr = internal::ParseContext::ParseMessage<google::protobuf::SourceCodeInfo>
                        (ctx,msg_04,ptr_00);
        goto LAB_0016b944;
      }
      break;
    case 10:
      if (cVar10 == 'P') {
        ptr = ptr_00 + -1;
        do {
          bVar1 = ((byte *)ptr)[1];
          auVar4._8_8_ = (long)(char)bVar1;
          auVar4._0_8_ = (byte *)ptr + 2;
          auVar6 = auVar4._0_12_;
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[2];
            uVar11 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar15 = internal::VarintParseSlow64((char *)((byte *)ptr + 1),uVar11);
              auVar6 = pVar15._0_12_;
            }
            else {
              auVar6._8_4_ = uVar11;
              auVar6._0_8_ = (byte *)ptr + 3;
            }
          }
          ptr = auVar6._0_8_;
          iVar12 = (this->public_dependency_).current_size_;
          if (iVar12 == (this->public_dependency_).total_size_) {
            RepeatedField<int>::Reserve(this_01,iVar12 + 1);
            iVar12 = this_01->current_size_;
          }
          (this->public_dependency_).current_size_ = iVar12 + 1;
          *(int *)((long)(this->public_dependency_).arena_or_elements_ + (long)iVar12 * 4) =
               auVar6._8_4_;
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x50));
        goto LAB_0016b200;
      }
      object = this_01;
      if ((tag & 0xff) == 0x52) {
LAB_0016b917:
        ptr = internal::PackedInt32Parser(object,ptr_00,ctx);
        goto LAB_0016b944;
      }
      break;
    case 0xb:
      if (cVar10 == 'X') {
        ptr = ptr_00 + -1;
        do {
          bVar1 = ((byte *)ptr)[1];
          auVar5._8_8_ = (long)(char)bVar1;
          auVar5._0_8_ = (byte *)ptr + 2;
          auVar7 = auVar5._0_12_;
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[2];
            uVar11 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar15 = internal::VarintParseSlow64((char *)((byte *)ptr + 1),uVar11);
              auVar7 = pVar15._0_12_;
            }
            else {
              auVar7._8_4_ = uVar11;
              auVar7._0_8_ = (byte *)ptr + 3;
            }
          }
          ptr = auVar7._0_8_;
          iVar12 = (this->weak_dependency_).current_size_;
          if (iVar12 == (this->weak_dependency_).total_size_) {
            RepeatedField<int>::Reserve(this_00,iVar12 + 1);
            iVar12 = this_00->current_size_;
          }
          (this->weak_dependency_).current_size_ = iVar12 + 1;
          *(int *)((long)(this->weak_dependency_).arena_or_elements_ + (long)iVar12 * 4) =
               auVar7._8_4_;
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x58));
        goto LAB_0016b200;
      }
      object = this_00;
      if ((tag & 0xff) == 0x5a) goto LAB_0016b917;
      break;
    case 0xc:
      if (cVar10 == 'b') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pAVar13 = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
        if (((ulong)pAVar13 & 1) != 0) {
          pAVar13 = *(Arena **)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x18);
        }
        psVar8 = (this->syntax_).ptr_;
        this_02 = &this->syntax_;
        if (psVar8 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) goto LAB_0016b643;
        goto LAB_0016b655;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      return ptr_00;
    }
    ptr = internal::UnknownFieldParse(tag,metadata,ptr_00,ctx);
LAB_0016b944:
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* FileDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FileDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string package = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_package(), ptr, ctx, "google.protobuf.FileDescriptorProto.package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string dependency = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_dependency(), ptr, ctx, "google.protobuf.FileDescriptorProto.dependency");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_message_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_service(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<58>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_code_info(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 public_dependency = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_public_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<80>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_public_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 weak_dependency = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_weak_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<88>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_weak_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string syntax = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_syntax(), ptr, ctx, "google.protobuf.FileDescriptorProto.syntax");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}